

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_encoder.c
# Opt level: O0

_Bool is_options_valid(lzma_options_lzma *options)

{
  _Bool _Var1;
  _Bool local_12;
  _Bool local_11;
  lzma_options_lzma *options_local;
  
  _Var1 = is_lclppb_valid(options);
  local_11 = false;
  if (((_Var1) && (local_11 = false, 1 < options->nice_len)) &&
     (local_11 = false, options->nice_len < 0x112)) {
    local_12 = true;
    if (options->mode != LZMA_MODE_FAST) {
      local_12 = options->mode == LZMA_MODE_NORMAL;
    }
    local_11 = local_12;
  }
  return local_11;
}

Assistant:

static bool
is_options_valid(const lzma_options_lzma *options)
{
	// Validate some of the options. LZ encoder validates nice_len too
	// but we need a valid value here earlier.
	return is_lclppb_valid(options)
			&& options->nice_len >= MATCH_LEN_MIN
			&& options->nice_len <= MATCH_LEN_MAX
			&& (options->mode == LZMA_MODE_FAST
				|| options->mode == LZMA_MODE_NORMAL);
}